

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

dynamic_string * __thiscall crnlib::dynamic_string::crop(dynamic_string *this,uint start,uint len)

{
  uint uVar1;
  char *__dest;
  char *pcVar2;
  uint len_local;
  uint start_local;
  dynamic_string *this_local;
  
  if (start < this->m_len) {
    uVar1 = math::minimum<unsigned_int>(len,this->m_len - start);
    if (start != 0) {
      __dest = get_ptr_priv(this);
      pcVar2 = get_ptr_priv(this);
      memmove(__dest,pcVar2 + start,(ulong)uVar1);
    }
    this->m_pStr[uVar1] = '\0';
    this->m_len = (uint16)uVar1;
    check(this);
  }
  else {
    clear(this);
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::crop(uint start, uint len)
    {
        if (start >= m_len)
        {
            clear();
            return *this;
        }

        len = math::minimum<uint>(len, m_len - start);

        if (start)
        {
            memmove(get_ptr_priv(), get_ptr_priv() + start, len);
        }

        m_pStr[len] = '\0';

        m_len = static_cast<uint16>(len);

        check();

        return *this;
    }